

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colAlloc.c
# Opt level: O3

int TestCell(Page *page,size_t index)

{
  return 1 << ((byte)index & 7) & (uint)(byte)(*page)[(index >> 3) + 0x10];
}

Assistant:

int
TestCell(
    Page *page,     /*!< The page. */
    size_t index)   /*!< Index of cell. */
{
#if CELLS_PER_PAGE == 64
#   ifdef COL_BIGENDIAN
        return (*(uint64_t*) PAGE_BITMASK(page) & (((uint64_t)1)<<(63-index))?1:0;
#   else
        return (*(uint64_t*) PAGE_BITMASK(page) & (((uint64_t)1)<<index))?1:0;
#   endif
#else
    unsigned char *mask = PAGE_BITMASK(page);
    return mask[index>>3] & (1<<(index&7));
#endif
}